

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  pointer pOVar1;
  uint32_t index;
  bool bVar2;
  _Type member_idx;
  iterator iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t type_id;
  uint32_t local_44;
  undefined1 local_40 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_20;
  
  if ((inst->opcode_ != OpMemberName) && (inst->opcode_ != OpMemberDecorate)) {
    __assert_fail("inst->opcode() == spv::Op::OpMemberName || inst->opcode() == spv::Op::OpMemberDecorate"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x16e,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction *)"
                 );
  }
  index = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    index = (uint)inst->has_result_id_;
  }
  local_44 = Instruction::GetSingleWordOperand(inst,index);
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->used_members_)._M_h,&local_44);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
LAB_0020158c:
    bVar2 = false;
  }
  else {
    uVar5 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar5 = (uint)inst->has_result_id_;
    }
    member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar5 + 1);
    local_40._16_4_ = GetNewMemberIndex(this,local_44,(uint32_t)member_idx);
    if ((_Type)local_40._16_4_ == (_Type)0xffffffff) {
      IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
    }
    else {
      if ((_Type)local_40._16_4_ == member_idx) goto LAB_0020158c;
      local_40._24_8_ = local_40 + 0x10;
      local_40._0_8_ = &PTR__SmallVector_003d7c78;
      local_20._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_40._8_8_ = 1;
      uVar4 = (ulong)(inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar4 = (ulong)inst->has_result_id_;
      }
      uVar4 = uVar4 + 1;
      pOVar1 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
              -0x5555555555555555;
      if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar1->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar4 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_40);
      local_40._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_20._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_20,local_20._M_head_impl);
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpMemberName ||
         inst->opcode() == spv::Op::OpMemberDecorate);

  uint32_t type_id = inst->GetSingleWordInOperand(0);
  auto live_members = used_members_.find(type_id);
  if (live_members == used_members_.end()) {
    return false;
  }

  uint32_t orig_member_idx = inst->GetSingleWordInOperand(1);
  uint32_t new_member_idx = GetNewMemberIndex(type_id, orig_member_idx);

  if (new_member_idx == kRemovedMember) {
    context()->KillInst(inst);
    return true;
  }

  if (new_member_idx == orig_member_idx) {
    return false;
  }

  inst->SetInOperand(1, {new_member_idx});
  return true;
}